

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Method.cpp
# Opt level: O2

int Lodtalk::CompiledMethod::stObjectAtPut(InterpreterProxy *interpreter)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar3;
  undefined4 extraout_var_02;
  ulong uVar4;
  Oop indexOop;
  undefined4 extraout_var_01;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) != 2) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar1;
  }
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  aVar3._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
  aVar3.uintValue._4_4_ = extraout_var_01;
  indexOop.field_0 = aVar3;
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,1);
  if ((aVar3._0_4_ & 1) == 0) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar1;
  }
  uVar4 = Oop::decodeSmallInteger(&indexOop);
  if (((long)uVar4 < 1) ||
     ((ulong)(*(uint *)(CONCAT44(extraout_var_00,iVar1) + 8) >> 1 & 0xffff) + 1 < uVar4)) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
  }
  else {
    *(ulong *)(CONCAT44(extraout_var_00,iVar1) + uVar4 * 8) = CONCAT44(extraout_var_02,iVar2);
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x17])
                      (interpreter,CONCAT44(extraout_var_02,iVar2));
  }
  return iVar1;
}

Assistant:

int CompiledMethod::stObjectAtPut(InterpreterProxy *interpreter)
{
    if (interpreter->getArgumentCount() != 2)
        return interpreter->primitiveFailed();

    auto selfOop = interpreter->getReceiver();
    auto self = reinterpret_cast<CompiledMethod*> (selfOop.pointer);

    auto indexOop = interpreter->getTemporary(0);
    auto valueOop = interpreter->getTemporary(1);
    if (!indexOop.isSmallInteger())
        return interpreter->primitiveFailed();

    auto index = indexOop.decodeSmallInteger();
    if (index < 1 || index > (SmallIntegerValue)self->getLiteralCount() + 1)
        return interpreter->primitiveFailed();

    reinterpret_cast<Oop*> (self->getFirstFieldPointer())[index - 1] = valueOop;
    return interpreter->returnOop(valueOop);
}